

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O0

char * format_mode(GLFWvidmode *mode)

{
  int iVar1;
  int gcd;
  GLFWvidmode *mode_local;
  
  iVar1 = euclid(mode->width,mode->height);
  snprintf(format_mode::buffer,0x200,"%i x %i x %i (%i:%i) (%i %i %i) %i Hz",
           (ulong)(uint)mode->width,(ulong)(uint)mode->height,
           (ulong)(uint)(mode->redBits + mode->greenBits + mode->blueBits),mode->width / iVar1,
           mode->height / iVar1,mode->redBits,mode->greenBits,mode->blueBits,mode->refreshRate);
  format_mode::buffer[0x1ff] = '\0';
  return format_mode::buffer;
}

Assistant:

static const char* format_mode(const GLFWvidmode* mode)
{
    static char buffer[512];
    const int gcd = euclid(mode->width, mode->height);

    snprintf(buffer,
             sizeof(buffer),
             "%i x %i x %i (%i:%i) (%i %i %i) %i Hz",
             mode->width, mode->height,
             mode->redBits + mode->greenBits + mode->blueBits,
             mode->width / gcd, mode->height / gcd,
             mode->redBits, mode->greenBits, mode->blueBits,
             mode->refreshRate);

    buffer[sizeof(buffer) - 1] = '\0';
    return buffer;
}